

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  ImGuiDir clip_dir;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImRect bb_rel;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    return;
  }
  bVar3 = NavMoveRequestButNoResultYet();
  if (!bVar3) {
    return;
  }
  if (pIVar1->NavMoveRequestForward != ImGuiNavForward_None) {
    return;
  }
  if (pIVar1->NavLayer != ImGuiNavLayer_Main) {
    return;
  }
  if (move_flags == 0) {
    __assert_fail("move_flags != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1fc0,"void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *, ImGuiNavMoveFlags)")
    ;
  }
  bb_rel.Min = window->NavRectRel[0].Min;
  bb_rel.Max = window->NavRectRel[0].Max;
  iVar4 = pIVar1->NavMoveDir;
  bVar3 = (move_flags & 5U) == 0;
  clip_dir = iVar4;
  if (iVar4 == 0) {
    if ((move_flags & 5U) == 0) {
      iVar4 = 0;
      clip_dir = 0;
      goto LAB_001d5041;
    }
    fVar7 = (window->SizeFull).x;
    fVar6 = (window->WindowPadding).x;
    fVar6 = fVar6 + fVar6 + (window->ContentSize).x;
    uVar5 = -(uint)(fVar6 <= fVar7);
    fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)fVar6) - (window->Scroll).x;
    clip_dir = 0;
    if ((move_flags & 4U) != 0) {
      clip_dir = 2;
      fVar6 = bb_rel.Max.y - bb_rel.Min.y;
      bb_rel.Min.y = bb_rel.Min.y - fVar6;
      bb_rel.Max.y = bb_rel.Max.y - fVar6;
    }
    bb_rel.Max.x = fVar7;
    bb_rel.Min.x = fVar7;
    bVar3 = false;
    NavMoveRequestForward(0,clip_dir,&bb_rel,move_flags);
    iVar4 = pIVar1->NavMoveDir;
  }
  if (!(bool)(iVar4 != 1 | bVar3)) {
    fVar7 = (window->Scroll).x;
    fVar2 = bb_rel.Max.y;
    bb_rel.Max = (ImVec2)(CONCAT44(bb_rel.Max.y,fVar7) ^ 0x80000000);
    fVar6 = bb_rel.Min.y;
    bb_rel.Min = (ImVec2)(CONCAT44(bb_rel.Min.y,fVar7) ^ 0x80000000);
    if ((move_flags & 4U) != 0) {
      fVar7 = fVar2 - fVar6;
      bb_rel.Min.y = fVar6 + fVar7;
      bb_rel.Max.y = fVar7 + fVar2;
      clip_dir = 3;
    }
    NavMoveRequestForward(1,clip_dir,&bb_rel,move_flags);
    iVar4 = pIVar1->NavMoveDir;
  }
LAB_001d5041:
  if (((move_flags & 10U) != 0) && (iVar4 == 2)) {
    fVar7 = (window->SizeFull).y;
    fVar6 = (window->WindowPadding).y;
    fVar6 = fVar6 + fVar6 + (window->ContentSize).y;
    uVar5 = -(uint)(fVar6 <= fVar7);
    fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)fVar6) - (window->Scroll).y;
    if ((move_flags & 8U) != 0) {
      fVar6 = bb_rel.Max.x - bb_rel.Min.x;
      bb_rel.Min.x = bb_rel.Min.x - fVar6;
      bb_rel.Max.x = bb_rel.Max.x - fVar6;
      clip_dir = 0;
    }
    bb_rel.Max.y = fVar7;
    bb_rel.Min.y = fVar7;
    NavMoveRequestForward(2,clip_dir,&bb_rel,move_flags);
    iVar4 = pIVar1->NavMoveDir;
  }
  if (((move_flags & 10U) != 0) && (iVar4 == 3)) {
    fVar7 = (window->Scroll).y;
    fVar2 = bb_rel.Max.x;
    bb_rel.Max = (ImVec2)(CONCAT44(fVar7,bb_rel.Max.x) ^ 0x8000000000000000);
    fVar6 = bb_rel.Min.x;
    bb_rel.Min = (ImVec2)(CONCAT44(fVar7,bb_rel.Min.x) ^ 0x8000000000000000);
    if ((move_flags & 8U) != 0) {
      clip_dir = 1;
      fVar7 = fVar2 - fVar6;
      bb_rel.Min.x = fVar6 + fVar7;
      bb_rel.Max.x = fVar7 + fVar2;
    }
    NavMoveRequestForward(3,clip_dir,&bb_rel,move_flags);
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->ContentSize.x + window->WindowPadding.x * 2.0f) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->ContentSize.y + window->WindowPadding.y * 2.0f) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}